

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

upb_MiniTableField * upb_MiniTable_FindFieldByNumber(upb_MiniTable *m,uint32_t number)

{
  uint uVar1;
  upb_MiniTableField *puVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar6 = (ulong)number - 1;
  uVar4 = (ulong)m->dense_below_dont_copy_me__upb_internal_use_only;
  if (uVar6 < uVar4) {
    if (m->fields_dont_copy_me__upb_internal_use_only[uVar6].
        number_dont_copy_me__upb_internal_use_only != number) {
      __assert_fail("m->fields_dont_copy_me__upb_internal_use_only[i].number_dont_copy_me__upb_internal_use_only == number"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/message.c"
                    ,0x18,
                    "const upb_MiniTableField *upb_MiniTable_FindFieldByNumber(const upb_MiniTable *, uint32_t)"
                   );
    }
    puVar2 = m->fields_dont_copy_me__upb_internal_use_only + uVar6;
  }
  else {
    iVar5 = m->field_count_dont_copy_me__upb_internal_use_only - 1;
    do {
      uVar3 = (uint)uVar4;
      if (iVar5 < (int)uVar3) {
        return (upb_MiniTableField *)0x0;
      }
      uVar7 = uVar3 + iVar5 >> 1;
      puVar2 = m->fields_dont_copy_me__upb_internal_use_only + uVar7;
      uVar1 = m->fields_dont_copy_me__upb_internal_use_only[uVar7].
              number_dont_copy_me__upb_internal_use_only;
      uVar8 = uVar7 + 1;
      if (number <= uVar1) {
        iVar5 = uVar7 - 1;
        uVar8 = uVar3;
      }
      uVar4 = (ulong)uVar8;
    } while (uVar1 != number);
  }
  return puVar2;
}

Assistant:

const upb_MiniTableField* upb_MiniTable_FindFieldByNumber(
    const upb_MiniTable* m, uint32_t number) {
  const size_t i = ((size_t)number) - 1;  // 0 wraps to SIZE_MAX

  // Ideal case: index into dense fields
  if (i < m->UPB_PRIVATE(dense_below)) {
    UPB_ASSERT(m->UPB_PRIVATE(fields)[i].UPB_PRIVATE(number) == number);
    return &m->UPB_PRIVATE(fields)[i];
  }

  // Slow case: binary search
  uint32_t lo = m->UPB_PRIVATE(dense_below);
  int32_t hi = m->UPB_PRIVATE(field_count) - 1;
  const upb_MiniTableField* base = m->UPB_PRIVATE(fields);
  while (hi >= (int32_t)lo) {
    uint32_t mid = (hi + lo) / 2;
    uint32_t num = base[mid].UPB_ONLYBITS(number);
    // These comparison operations allow, on ARM machines, to fuse all these
    // branches into one comparison followed by two CSELs to set the lo/hi
    // values, followed by a BNE to continue or terminate the loop. Since binary
    // search branches are generally unpredictable (50/50 in each direction),
    // this is a good deal. We use signed for the high, as this decrement may
    // underflow if mid is 0.
    int32_t hi_mid = mid - 1;
    uint32_t lo_mid = mid + 1;
    if (num == number) {
      return &base[mid];
    }
    if (UPB_UNPREDICTABLE(num < number)) {
      lo = lo_mid;
    } else {
      hi = hi_mid;
    }
  }

  return NULL;
}